

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall Tjen::Node::Node(Node *this,string *name)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  uStack_28 = in_RAX;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map
            ((_Deque_base<char,_std::allocator<char>_> *)&this->stack,0);
  std::__cxx11::string::_M_assign((string *)this);
  uStack_28 = CONCAT17(0x7a,(undefined7)uStack_28);
  std::deque<char,_std::allocator<char>_>::emplace_back<char>
            (&(this->stack).c,(char *)((long)&uStack_28 + 7));
  return;
}

Assistant:

Tjen::Node::Node(std::string name) {
    this->name = name;
    stack.push('z');

}